

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::open_files(Container *this)

{
  int iVar1;
  ContextManager *pCVar2;
  TaskData *pTVar3;
  string sStack_38;
  
  pTVar3 = (this->task_data_).ptr_;
  if ((pTVar3->stdin_desc).filename.size_ != 0) {
    iVar1 = open((pTVar3->stdin_desc).filename.data_,0);
    pTVar3 = (this->task_data_).ptr_;
    (pTVar3->stdin_desc).fd = iVar1;
    if (iVar1 < 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&sStack_38,"Cannot open \'%s\': %m",
                        (((this->task_data_).ptr_)->stdin_desc).filename.data_);
      (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      pTVar3 = (this->task_data_).ptr_;
    }
  }
  if ((pTVar3->stdout_desc).filename.size_ != 0) {
    iVar1 = open((pTVar3->stdout_desc).filename.data_,0x201);
    pTVar3 = (this->task_data_).ptr_;
    (pTVar3->stdout_desc).fd = iVar1;
    if (iVar1 < 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&sStack_38,"Cannot open \'%s\': %m",
                        (((this->task_data_).ptr_)->stdout_desc).filename.data_);
      (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      pTVar3 = (this->task_data_).ptr_;
    }
  }
  if ((pTVar3->stderr_desc).filename.size_ != 0) {
    iVar1 = open((pTVar3->stderr_desc).filename.data_,0x201);
    (((this->task_data_).ptr_)->stderr_desc).fd = iVar1;
    if (iVar1 < 0) {
      pCVar2 = ContextManager::get();
      format_abi_cxx11_(&sStack_38,"Cannot open \'%s\': %m",
                        (((this->task_data_).ptr_)->stderr_desc).filename.data_);
      (**pCVar2->_vptr_ContextManager)(pCVar2,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return;
}

Assistant:

void Container::open_files() {
    if (!task_data_->stdin_desc.filename.empty()) {
        task_data_->stdin_desc.fd = open(task_data_->stdin_desc.filename.c_str(), O_RDONLY);
        if (task_data_->stdin_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stdin_desc.filename.c_str()));
        }
    }

    if (!task_data_->stdout_desc.filename.empty()) {
        task_data_->stdout_desc.fd =
            open(task_data_->stdout_desc.filename.c_str(), O_WRONLY | O_TRUNC);
        if (task_data_->stdout_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stdout_desc.filename.c_str()));
        }
    }

    if (!task_data_->stderr_desc.filename.empty()) {
        task_data_->stderr_desc.fd = open(task_data_->stderr_desc.filename.c_str(), O_WRONLY | O_TRUNC);
        if (task_data_->stderr_desc.fd < 0) {
            die(format("Cannot open '%s': %m", task_data_->stderr_desc.filename.c_str()));
        }
    }
}